

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O3

Template * StringToTemplateWithAutoEscaping(string *s,Strip strip,TemplateContext context)

{
  Template *pTVar1;
  size_type __dnew;
  string text;
  
  pTVar1 = (Template *)
           (*(code *)(&DAT_00123004 +
                     *(int *)(&DAT_00123004 + (ulong)(strip - STRIP_BLANK_LINES) * 4)))();
  return pTVar1;
}

Assistant:

static Template* StringToTemplateWithAutoEscaping(const string& s,
                                                  Strip strip,
                                                  TemplateContext context) {
  string text = GetPragmaForContext(context) + s;
  return Template::GetTemplate(StringToTemplateFile(text), strip);
}